

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v5::
format<fmt::v5::basic_string_view<char>,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,v5 *this,basic_string_view<char> *format_str,int *args,int *args_1,int *args_2,
          int *args_3,int *args_4,int *args_5,int *args_6,int *args_7,int *args_8,int *args_9,
          int *args_10,int *args_11,int *args_12,int *args_13,int *args_14,int *args_15,int *args_16
          ,int *args_17,int *args_18,int *args_19)

{
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_20;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  undefined **local_4d0;
  undefined1 *local_4c8;
  long local_4c0;
  undefined8 local_4b8;
  undefined1 local_4b0 [504];
  ulong local_2b8 [2];
  undefined4 local_2a8;
  ulong local_298;
  undefined4 local_288;
  ulong local_278;
  undefined4 local_268;
  ulong local_258;
  undefined4 local_248;
  ulong local_238;
  undefined4 local_228;
  ulong local_218;
  undefined4 local_208;
  ulong local_1f8;
  undefined4 local_1e8;
  ulong local_1d8;
  undefined4 local_1c8;
  ulong local_1b8;
  undefined4 local_1a8;
  ulong local_198;
  undefined4 local_188;
  ulong local_178;
  undefined4 local_168;
  ulong local_158;
  undefined4 local_148;
  ulong local_138;
  undefined4 local_128;
  ulong local_118;
  undefined4 local_108;
  ulong local_f8;
  undefined4 local_e8;
  ulong local_d8;
  undefined4 local_c8;
  ulong local_b8;
  undefined4 local_a8;
  ulong local_98;
  undefined4 local_88;
  ulong local_78;
  undefined4 local_68;
  ulong local_58;
  undefined4 local_48;
  undefined4 local_38;
  undefined4 local_28;
  
  local_2a8 = 2;
  local_2b8[0] = (ulong)*(uint *)&format_str->data_;
  local_288 = 2;
  local_298 = (ulong)(uint)*args;
  local_268 = 2;
  local_278 = (ulong)(uint)*args_1;
  local_248 = 2;
  local_258 = (ulong)(uint)*args_2;
  local_228 = 2;
  local_238 = (ulong)(uint)*args_3;
  local_208 = 2;
  local_218 = (ulong)(uint)*args_4;
  local_1e8 = 2;
  local_1f8 = (ulong)(uint)*args_5;
  local_1c8 = 2;
  local_1d8 = (ulong)(uint)*args_6;
  local_1a8 = 2;
  local_1b8 = (ulong)(uint)*args_7;
  local_188 = 2;
  local_198 = (ulong)(uint)*args_8;
  local_168 = 2;
  local_178 = (ulong)(uint)*args_9;
  local_148 = 2;
  local_158 = (ulong)(uint)*args_10;
  local_128 = 2;
  local_138 = (ulong)(uint)*args_11;
  local_108 = 2;
  local_118 = (ulong)(uint)*args_12;
  local_e8 = 2;
  local_f8 = (ulong)(uint)*args_13;
  local_c8 = 2;
  local_d8 = (ulong)(uint)*args_14;
  local_a8 = 2;
  local_b8 = (ulong)(uint)*args_15;
  local_88 = 2;
  local_98 = (ulong)(uint)*args_16;
  local_68 = 2;
  local_78 = (ulong)(uint)*args_17;
  local_48 = 2;
  local_58 = (ulong)(uint)*args_18;
  local_38 = 0;
  local_28 = 0;
  local_4c0 = 0;
  local_4d0 = &PTR_grow_002a3c18;
  local_4b8 = 500;
  args_20.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_2b8;
  args_20.types_ =
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int>
       ::TYPES;
  local_4c8 = local_4b0;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_4d0,*(basic_string_view<char> *)this,args_20,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_4c8,local_4c8 + local_4c0);
  local_4d0 = &PTR_grow_002a3c18;
  if (local_4c8 != local_4b0) {
    operator_delete(local_4c8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<FMT_CHAR(S)> format(
    const S &format_str, const Args &... args) {
  return internal::vformat(
    to_string_view(format_str),
    *internal::checked_args<S, Args...>(format_str, args...));
}